

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O3

void __thiscall DSDcc::DSDDstar::processVoice(DSDDstar *this)

{
  uchar *puVar1;
  int iVar2;
  char (*pacVar3) [24];
  uint uVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  DSDDecoder *pDVar8;
  
  uVar4 = DSDSymbol::getDibit(&this->m_dsdDecoder->m_dsdSymbol);
  if (this->m_symbolIndex == 0) {
    pDVar8 = this->m_dsdDecoder;
    pacVar3 = pDVar8->ambe_fr;
    *(char *)((long)(pacVar3 + 3) + 8) = '\0';
    *(char *)((long)(pacVar3 + 3) + 9) = '\0';
    *(char *)((long)(pacVar3 + 3) + 10) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0xb) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0xc) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0xd) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0xe) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0xf) = '\0';
    pacVar3 = pDVar8->ambe_fr;
    *(char *)((long)(pacVar3 + 3) + 0x10) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0x11) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0x12) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0x13) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0x14) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0x15) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0x16) = '\0';
    *(char *)((long)(pacVar3 + 3) + 0x17) = '\0';
    pacVar3 = pDVar8->ambe_fr;
    *(char *)((long)(pacVar3 + 2) + 0x10) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0x11) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0x12) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0x13) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0x14) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0x15) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0x16) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0x17) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 3) + 0) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 3) + 1) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 3) + 2) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 3) + 3) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 3) + 4) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 3) + 5) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 3) + 6) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 3) + 7) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 2) + 0) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 2) + 1) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 2) + 2) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 2) + 3) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 2) + 4) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 2) + 5) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 2) + 6) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 2) + 7) = '\0';
    pacVar3 = pDVar8->ambe_fr;
    *(char *)((long)(pacVar3 + 2) + 8) = '\0';
    *(char *)((long)(pacVar3 + 2) + 9) = '\0';
    *(char *)((long)(pacVar3 + 2) + 10) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0xb) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0xc) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0xd) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0xe) = '\0';
    *(char *)((long)(pacVar3 + 2) + 0xf) = '\0';
    pacVar3 = pDVar8->ambe_fr;
    *(char *)((long)(pacVar3 + 1) + 8) = '\0';
    *(char *)((long)(pacVar3 + 1) + 9) = '\0';
    *(char *)((long)(pacVar3 + 1) + 10) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0xb) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0xc) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0xd) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0xe) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0xf) = '\0';
    pacVar3 = pDVar8->ambe_fr;
    *(char *)((long)(pacVar3 + 1) + 0x10) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0x11) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0x12) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0x13) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0x14) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0x15) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0x16) = '\0';
    *(char *)((long)(pacVar3 + 1) + 0x17) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0x10) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0x11) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0x12) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0x13) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0x14) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0x15) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0x16) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0x17) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 1) + 0) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 1) + 1) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 1) + 2) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 1) + 3) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 1) + 4) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 1) + 5) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 1) + 6) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 1) + 7) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 1) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 2) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 3) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 4) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 5) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 6) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 7) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 8) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 9) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 10) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0xb) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0xc) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0xd) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0xe) = '\0';
    *(char *)((long)(pDVar8->ambe_fr + 0) + 0xf) = '\0';
    pDVar8 = this->m_dsdDecoder;
    pDVar8->m_mbeDVFrame1[8] = '\0';
    pDVar8->m_mbeDVFrame1[0] = '\0';
    pDVar8->m_mbeDVFrame1[1] = '\0';
    pDVar8->m_mbeDVFrame1[2] = '\0';
    pDVar8->m_mbeDVFrame1[3] = '\0';
    pDVar8->m_mbeDVFrame1[4] = '\0';
    pDVar8->m_mbeDVFrame1[5] = '\0';
    pDVar8->m_mbeDVFrame1[6] = '\0';
    pDVar8->m_mbeDVFrame1[7] = '\0';
    piVar7 = &dW;
    this->w = &dW;
    piVar5 = &dX;
    this->x = &dX;
  }
  else {
    piVar7 = this->w;
    piVar5 = this->x;
  }
  this->m_dsdDecoder->ambe_fr[*piVar7][*piVar5] = (byte)uVar4 & 1;
  piVar7 = this->w;
  this->w = piVar7 + 1;
  this->x = this->x + 1;
  iVar2 = this->m_symbolIndex;
  iVar6 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar6 = iVar2;
  }
  puVar1 = this->m_dsdDecoder->m_mbeDVFrame1 + (iVar6 >> 3);
  *puVar1 = *puVar1 | (byte)((uVar4 & 1) << ((byte)iVar2 & 7));
  if (this->m_symbolIndex == 0x47) {
    pDVar8 = this->m_dsdDecoder;
    if ((pDVar8->m_opts).errorbars == 1) {
      DSDLogger::log(&pDVar8->m_dsdLogger,(double)(piVar7 + 1));
      pDVar8 = this->m_dsdDecoder;
    }
    DSDMBEDecoder::processFrame
              (&pDVar8->m_mbeDecoder1,(char (*) [23])0x0,pDVar8->ambe_fr,(char (*) [24])0x0);
    this->m_dsdDecoder->m_mbeDVReady1 = true;
    this->m_symbolIndex = 0;
    if (this->m_voiceFrameCount < 0x14) {
      this->m_frameType = DStarDataFrame;
      this->m_voiceFrameCount = this->m_voiceFrameCount + 1;
    }
    else {
      this->m_frameType = DStarSyncFrame;
    }
  }
  else {
    this->m_symbolIndex = this->m_symbolIndex + 1;
  }
  return;
}

Assistant:

void DSDDstar::processVoice()
{
    unsigned char bit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get bit from symbol and store it in cache

    if (m_symbolIndex == 0) {
        initVoiceFrame();
    }

    m_dsdDecoder->ambe_fr[*w][*x] = (1 & bit);
    w++;
    x++;

    storeSymbolDV(m_symbolIndex, (1 & bit)); // store bits in order in DVSI frame

    if (m_symbolIndex == 72-1)
    {
//        std::cerr << "DSDDstar::processVoice: " << m_voiceFrameCount << std::endl;

        if (m_dsdDecoder->m_opts.errorbars == 1) {
            m_dsdDecoder->getLogger().log("\nMBE: ");
        }

        m_dsdDecoder->m_mbeDecoder1.processFrame(0, m_dsdDecoder->ambe_fr, 0);
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        m_symbolIndex = 0;

        if (m_voiceFrameCount < 20)
        {
            m_frameType = DStarDataFrame;
            m_voiceFrameCount++;
        }
        else
        {
            m_frameType = DStarSyncFrame;
        }
    }
    else
    {
        m_symbolIndex++;
    }
}